

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O3

void MallocBlock::ProcessFreeQueue(MallocBlock *b,size_t size,int max_free_queue_size)

{
  undefined8 *puVar1;
  MallocBlock *pMVar2;
  ThreadCache *pTVar3;
  void *pvVar4;
  Span *pSVar5;
  SpinLock SVar6;
  uintptr_t uVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  MallocBlockQueueEntry *queue_entry;
  FreeQueue<MallocBlockQueueEntry> *this;
  undefined8 *in_FS_OFFSET;
  bool bVar15;
  MallocBlockQueueEntry local_408;
  undefined1 local_368 [8];
  MallocBlockQueueEntry entries [4];
  undefined1 local_e0 [8];
  MallocBlockQueueEntry new_entry;
  
  lVar9 = 0;
  do {
    *(undefined4 *)((long)entries[0].deleter_pcs + lVar9 + 0x78) = 0;
    *(undefined8 *)(local_368 + lVar9) = 0;
    *(undefined8 *)((long)entries[0].deleter_pcs + lVar9 + -0x10) = 0;
    lVar9 = lVar9 + 0xa0;
  } while (lVar9 != 0x280);
  MallocBlockQueueEntry::MallocBlockQueueEntry((MallocBlockQueueEntry *)local_e0,b,size);
  LOCK();
  bVar15 = (__atomic_base<int>)free_queue_lock_.lockword_.super___atomic_base<int>._M_i ==
           (__atomic_base<int>)0x0;
  if (bVar15) {
    free_queue_lock_.lockword_.super___atomic_base<int>._M_i = (atomic<int>)(__atomic_base<int>)0x1;
  }
  UNLOCK();
  if (!bVar15) {
    SpinLock::SlowLock(&free_queue_lock_);
  }
  if (free_queue_ == (FreeQueue<MallocBlockQueueEntry> *)0x0) {
    free_queue_ = (FreeQueue<MallocBlockQueueEntry> *)operator_new(0x28008);
    lVar9 = 0x90;
    do {
      *(undefined4 *)((long)free_queue_->q_[0].deleter_pcs + lVar9 + -0x10) = 0;
      puVar1 = (undefined8 *)((long)free_queue_ + lVar9 + -0x90);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar9 = lVar9 + 0xa0;
    } while (lVar9 != 0x28090);
    free_queue_->q_front_ = 0;
    free_queue_->q_back_ = 0;
    iVar10 = 0;
    iVar8 = 0;
  }
  else {
    iVar8 = free_queue_->q_front_;
    iVar10 = free_queue_->q_back_;
  }
  this = free_queue_;
  uVar14 = iVar8 + 0x400;
  if (-1 < (int)(iVar8 + 1U)) {
    uVar14 = iVar8 + 1U;
  }
  if ((iVar8 - (uVar14 & 0xfffffc00)) + 1 == iVar10) {
    syscall(1,2,"Check failed: !free_queue_->Full(): Free queue mustn\'t be full!\n",0x40);
    abort();
  }
  if (b != (MallocBlock *)0x0) {
    free_queue_size_ = free_queue_size_ + size + 0xa0;
    memcpy(free_queue_->q_ + iVar8,local_e0,0xa0);
    iVar8 = this->q_front_;
    uVar14 = iVar8 + 0x400;
    if (-1 < (int)(iVar8 + 1U)) {
      uVar14 = iVar8 + 1U;
    }
    this->q_front_ = (iVar8 - (uVar14 & 0xfffffc00)) + 1;
  }
  uVar11 = 0;
LAB_00118927:
  SVar6.lockword_.super___atomic_base<int>._M_i =
       free_queue_lock_.lockword_.super___atomic_base<int>._M_i;
  if (free_queue_size_ <= (ulong)(long)max_free_queue_size) {
    iVar8 = this->q_front_;
    uVar14 = iVar8 + 0x400;
    if (-1 < (int)(iVar8 + 1U)) {
      uVar14 = iVar8 + 1U;
    }
    if ((iVar8 - (uVar14 & 0xfffffc00)) + 1 != this->q_back_) goto LAB_00118b32;
  }
  new_entry.deleter_threadid = uVar11;
  FreeQueue<MallocBlockQueueEntry>::Pop(&local_408,this);
  uVar7 = new_entry.deleter_threadid;
  memcpy(&entries[uVar11 - 1].deleter_threadid,&local_408,0xa0);
  SVar6 = free_queue_lock_;
  free_queue_size_ = (free_queue_size_ - (long)entries[uVar11].block) - 0xa0;
  uVar14 = (int)uVar7 + 1;
  uVar11 = (ulong)uVar14;
  this = free_queue_;
  if (uVar14 == 4) {
    LOCK();
    free_queue_lock_.lockword_.super___atomic_base<int>._M_i = (atomic<int>)(__atomic_base<int>)0x0;
    UNLOCK();
    if ((__atomic_base<int>)SVar6.lockword_.super___atomic_base<int>._M_i != (__atomic_base<int>)0x1
       ) {
      SpinLock::SlowUnlock(&free_queue_lock_);
    }
    lVar9 = 0;
    do {
      CheckForDanglingWrites((MallocBlockQueueEntry *)(local_368 + lVar9));
      pMVar2 = ((MallocBlockQueueEntry *)(local_368 + lVar9))->block;
      pTVar3 = (ThreadCache *)*in_FS_OFFSET;
      uVar11 = (ulong)pMVar2 >> 0xd;
      uVar12 = *(ulong *)(tcmalloc::Static::pageheap_ + (uVar11 & 0xffff) * 8 + 0x10) ^
               uVar11 & 0x7ffffffff0000;
      if (uVar12 < 0x80) {
LAB_00118a2b:
        if (pTVar3 == (ThreadCache *)0x0) {
          ProcessFreeQueue();
        }
        else {
          uVar11 = uVar12 & 0xffffffff;
          uVar14 = pTVar3->list_[uVar11].length_ + 1;
          pvVar4 = pTVar3->list_[uVar11].list_;
          pTVar3->list_[uVar11].list_ = pMVar2;
          pMVar2->size1_ = (size_t)pvVar4;
          pTVar3->list_[uVar11].length_ = uVar14;
          if (pTVar3->list_[uVar11].max_length_ < uVar14) {
            tcmalloc::ThreadCache::ListTooLong(pTVar3,pTVar3->list_ + uVar11,(uint32_t)uVar12);
          }
          else {
            iVar8 = pTVar3->size_ + pTVar3->list_[uVar11].size_;
            pTVar3->size_ = iVar8;
            if (pTVar3->max_size_ < iVar8) {
              tcmalloc::ThreadCache::Scavenge(pTVar3);
            }
          }
        }
      }
      else if ((((ulong)pMVar2 >> 0x30 == 0) &&
               (*(long *)(tcmalloc::Static::pageheap_ + ((ulong)pMVar2 >> 0x1f) * 8 + 0x80010) != 0)
               ) && (pSVar5 = *(Span **)(*(long *)(tcmalloc::Static::pageheap_ +
                                                  ((ulong)pMVar2 >> 0x1f) * 8 + 0x80010) +
                                        (ulong)((uint)uVar11 & 0x3ffff) * 8), pSVar5 != (Span *)0x0)
              ) {
        uVar12 = (ulong)(byte)pSVar5->field_0x2a;
        if (uVar12 != 0) {
          *(ulong *)(tcmalloc::Static::pageheap_ + (uVar11 & 0xffff) * 8 + 0x10) =
               uVar11 & 0x7ffffffff0000 | uVar12;
          goto LAB_00118a2b;
        }
        anon_unknown.dwarf_5160::do_free_pages(pSVar5,pMVar2);
      }
      else if (pMVar2 != (MallocBlock *)0x0) {
        anon_unknown.dwarf_5160::InvalidFree(pMVar2);
      }
      lVar9 = lVar9 + 0xa0;
    } while (lVar9 != 0x280);
    uVar11 = 0;
    LOCK();
    bVar15 = (__atomic_base<int>)free_queue_lock_.lockword_.super___atomic_base<int>._M_i ==
             (__atomic_base<int>)0x0;
    if (bVar15) {
      free_queue_lock_.lockword_.super___atomic_base<int>._M_i =
           (atomic<int>)(__atomic_base<int>)0x1;
    }
    UNLOCK();
    this = free_queue_;
    if (!bVar15) {
      SpinLock::SlowLock(&free_queue_lock_);
      this = free_queue_;
    }
  }
  goto LAB_00118927;
LAB_00118b32:
  LOCK();
  free_queue_lock_.lockword_.super___atomic_base<int>._M_i = (atomic<int>)(__atomic_base<int>)0x0;
  UNLOCK();
  if ((__atomic_base<int>)SVar6.lockword_.super___atomic_base<int>._M_i != (__atomic_base<int>)0x1)
  {
    SpinLock::SlowUnlock(&free_queue_lock_);
  }
  if (0 < (int)uVar11) {
    queue_entry = (MallocBlockQueueEntry *)local_368;
    do {
      CheckForDanglingWrites(queue_entry);
      pMVar2 = queue_entry->block;
      pTVar3 = (ThreadCache *)*in_FS_OFFSET;
      uVar12 = (ulong)pMVar2 >> 0xd;
      uVar13 = *(ulong *)(tcmalloc::Static::pageheap_ + (uVar12 & 0xffff) * 8 + 0x10) ^
               uVar12 & 0x7ffffffff0000;
      if (uVar13 < 0x80) {
LAB_00118b90:
        if (pTVar3 == (ThreadCache *)0x0) {
          ProcessFreeQueue();
        }
        else {
          uVar12 = uVar13 & 0xffffffff;
          uVar14 = pTVar3->list_[uVar12].length_ + 1;
          pvVar4 = pTVar3->list_[uVar12].list_;
          pTVar3->list_[uVar12].list_ = pMVar2;
          pMVar2->size1_ = (size_t)pvVar4;
          pTVar3->list_[uVar12].length_ = uVar14;
          if (pTVar3->list_[uVar12].max_length_ < uVar14) {
            tcmalloc::ThreadCache::ListTooLong(pTVar3,pTVar3->list_ + uVar12,(uint32_t)uVar13);
          }
          else {
            iVar8 = pTVar3->size_ + pTVar3->list_[uVar12].size_;
            pTVar3->size_ = iVar8;
            if (pTVar3->max_size_ < iVar8) {
              tcmalloc::ThreadCache::Scavenge(pTVar3);
            }
          }
        }
      }
      else if ((((ulong)pMVar2 >> 0x30 == 0) &&
               (*(long *)(tcmalloc::Static::pageheap_ + ((ulong)pMVar2 >> 0x1f) * 8 + 0x80010) != 0)
               ) && (pSVar5 = *(Span **)(*(long *)(tcmalloc::Static::pageheap_ +
                                                  ((ulong)pMVar2 >> 0x1f) * 8 + 0x80010) +
                                        (ulong)((uint)uVar12 & 0x3ffff) * 8), pSVar5 != (Span *)0x0)
              ) {
        uVar13 = (ulong)(byte)pSVar5->field_0x2a;
        if (uVar13 != 0) {
          *(ulong *)(tcmalloc::Static::pageheap_ + (uVar12 & 0xffff) * 8 + 0x10) =
               uVar12 & 0x7ffffffff0000 | uVar13;
          goto LAB_00118b90;
        }
        anon_unknown.dwarf_5160::do_free_pages(pSVar5,pMVar2);
      }
      else if (pMVar2 != (MallocBlock *)0x0) {
        anon_unknown.dwarf_5160::InvalidFree(pMVar2);
      }
      queue_entry = queue_entry + 1;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
  }
  return;
}

Assistant:

static void ProcessFreeQueue(MallocBlock* b, size_t size,
                               int max_free_queue_size) {
    // MallocBlockQueueEntry are about 144 in size, so we can only
    // use a small array of them on the stack.
    MallocBlockQueueEntry entries[4];
    int num_entries = 0;
    MallocBlockQueueEntry new_entry(b, size);
    free_queue_lock_.Lock();
    if (free_queue_ == nullptr)
      free_queue_ = new FreeQueue<MallocBlockQueueEntry>;
    RAW_CHECK(!free_queue_->Full(), "Free queue mustn't be full!");

    if (b != nullptr) {
      free_queue_size_ += size + sizeof(MallocBlockQueueEntry);
      free_queue_->Push(new_entry);
    }

    // Free blocks until the total size of unfreed blocks no longer exceeds
    // max_free_queue_size, and the free queue has at least one free
    // space in it.
    while (free_queue_size_ > max_free_queue_size || free_queue_->Full()) {
      RAW_CHECK(num_entries < arraysize(entries), "entries array overflow");
      entries[num_entries] = free_queue_->Pop();
      free_queue_size_ -=
          entries[num_entries].size + sizeof(MallocBlockQueueEntry);
      num_entries++;
      if (num_entries == arraysize(entries)) {
        // The queue will not be full at this point, so it is ok to
        // release the lock.  The queue may still contain more than
        // max_free_queue_size, but this is not a strict invariant.
        free_queue_lock_.Unlock();
        for (int i = 0; i < num_entries; i++) {
          CheckForDanglingWrites(entries[i]);
          do_free(entries[i].block);
        }
        num_entries = 0;
        free_queue_lock_.Lock();
      }
    }
    free_queue_lock_.Unlock();
    for (int i = 0; i < num_entries; i++) {
      CheckForDanglingWrites(entries[i]);
      do_free(entries[i].block);
    }
  }